

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void DrawTexturePoly(Texture2D texture,Vector2 center,Vector2 *points,Vector2 *texcoords,
                    int pointsCount,Color tint)

{
  ulong uVar1;
  ulong uVar2;
  float local_48;
  float fStack_44;
  
  rlCheckRenderBatchLimit(pointsCount * 4 + -4);
  rlSetTexture(texture.id);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  fStack_44 = center.y;
  uVar2 = 0;
  uVar1 = (ulong)(pointsCount - 1U);
  if ((int)(pointsCount - 1U) < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    rlTexCoord2f(0.5,0.5);
    local_48 = center.x;
    rlVertex2f(local_48,fStack_44);
    rlTexCoord2f(texcoords[uVar2].x,texcoords[uVar2].y);
    rlVertex2f(points[uVar2].x + local_48,points[uVar2].y + fStack_44);
    rlTexCoord2f(texcoords[uVar2 + 1].x,texcoords[uVar2 + 1].y);
    rlVertex2f(points[uVar2 + 1].x + local_48,points[uVar2 + 1].y + fStack_44);
    rlTexCoord2f(texcoords[uVar2 + 1].x,texcoords[uVar2 + 1].y);
    rlVertex2f(points[uVar2 + 1].x + local_48,points[uVar2 + 1].y + fStack_44);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTexturePoly(Texture2D texture, Vector2 center, Vector2 *points, Vector2 *texcoords, int pointsCount, Color tint)
{
    rlCheckRenderBatchLimit((pointsCount - 1)*4);

    rlSetTexture(texture.id);

    // Texturing is only supported on QUADs
    rlBegin(RL_QUADS);

        rlColor4ub(tint.r, tint.g, tint.b, tint.a);

        for (int i = 0; i < pointsCount - 1; i++)
        {
            rlTexCoord2f(0.5f, 0.5f);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texcoords[i].x, texcoords[i].y);
            rlVertex2f(points[i].x + center.x, points[i].y + center.y);

            rlTexCoord2f(texcoords[i + 1].x, texcoords[i + 1].y);
            rlVertex2f(points[i + 1].x + center.x, points[i + 1].y + center.y);

            rlTexCoord2f(texcoords[i + 1].x, texcoords[i + 1].y);
            rlVertex2f(points[i + 1].x + center.x, points[i + 1].y + center.y);
        }
    rlEnd();

    rlSetTexture(0);
}